

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall
ktx::CommandExtract::decodeAndSaveASTC
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,char *compressedData,
          size_t compressedSize)

{
  bool bVar1;
  astcenc_error aVar2;
  VkFormat in_ECX;
  byte in_DL;
  string *in_RSI;
  Reporter *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  int in_stack_00000008;
  uchar *in_stack_00000010;
  ulong in_stack_00000018;
  VkFormat uncompressedVkFormat;
  uchar *bufferPtr;
  __array uncompressedBuffer;
  unsigned_long uncompressedSize;
  astcenc_image image;
  astcenc_context **context;
  ASTCencStruct astcenc;
  astcenc_config config;
  astcenc_profile profile;
  astcenc_error ec;
  uint blockSizeZ;
  uint blockSizeY;
  uint blockSizeX;
  uint threadCount;
  size_t in_stack_00000248;
  undefined4 in_stack_00000254;
  CommandExtract *in_stack_00000268;
  FormatDescriptor *in_stack_00000280;
  uint32_t in_stack_00000288;
  uint32_t in_stack_00000290;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  size_t in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  size_type *in_stack_fffffffffffffe28;
  VkFormat vkFormat_00;
  string local_150 [36];
  undefined4 local_12c;
  undefined8 local_128;
  pointer local_120 [2];
  ulong local_110;
  astcenc_image local_108;
  undefined8 local_e8;
  ASTCencStruct *local_d0;
  ASTCencStruct local_c8;
  undefined8 local_c0;
  astcenc_config local_b8;
  astcenc_profile local_3c;
  astcenc_error local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined4 local_28;
  int local_24;
  VkFormat local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_28 = 1;
  local_2c = ((uint)((ulong)*in_R8 >> 0x20) & 0xff) + 1;
  local_30 = ((uint)((ulong)*in_R8 >> 0x28) & 0xff) + 1;
  local_34 = ((ushort)((ulong)*in_R8 >> 0x30) & 0xff) + 1;
  local_38 = 0;
  local_24 = in_R9D;
  local_18 = in_ECX;
  bVar1 = isFormatSRGB(in_ECX);
  local_3c = (astcenc_profile)!bVar1;
  memset(&local_b8,0,0x78);
  local_38 = astcenc_config_init(local_3c,local_2c,local_30,local_34,60.0,0x10,&local_b8);
  if (local_38 != ASTCENC_SUCCESS) {
    in_stack_fffffffffffffe28 = &(in_RDI->commandName)._M_string_length;
    local_c0 = astcenc_get_error_string(local_38);
    Reporter::fatal<char_const(&)[34],char_const*>
              (in_RDI,(ReturnCode)((ulong)in_RSI >> 0x20),(char (*) [34])in_stack_fffffffffffffe28,
               (char **)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  }
  decodeAndSaveASTC::ASTCencStruct::ASTCencStruct(&local_c8);
  local_d0 = &local_c8;
  aVar2 = astcenc_context_alloc(&local_b8,1,&local_c8.context);
  local_38 = aVar2;
  if (aVar2 != ASTCENC_SUCCESS) {
    local_e8 = astcenc_get_error_string(aVar2);
    Reporter::fatal<char_const(&)[36],char_const*>
              (in_RDI,(ReturnCode)((ulong)in_RSI >> 0x20),(char (*) [36])in_stack_fffffffffffffe28,
               (char **)CONCAT44(aVar2,in_stack_fffffffffffffe20));
  }
  local_108.data = (void **)0x0;
  local_108.dim_z = 1;
  local_108.data_type = ASTCENC_TYPE_U8;
  local_110 = (ulong)(uint)(local_24 * in_stack_00000008 * 4);
  std::make_unique<unsigned_char[]>(in_stack_fffffffffffffdd8);
  local_120[0] = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  local_108.data = local_120;
  local_108._8_8_ = local_108._8_8_ & 0xffffffff;
  local_38 = astcenc_decompress_image
                       (local_d0->context,in_stack_00000010,in_stack_00000018,&local_108,
                        &decodeAndSaveASTC::swizzle,0);
  if (local_38 != ASTCENC_SUCCESS) {
    local_128 = astcenc_get_error_string(local_38);
    Reporter::fatal<char_const(&)[33],char_const*>
              (in_RDI,(ReturnCode)((ulong)in_RSI >> 0x20),(char (*) [33])in_stack_fffffffffffffe28,
               (char **)CONCAT44(aVar2,in_stack_fffffffffffffe20));
  }
  vkFormat_00 = (VkFormat)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  astcenc_decompress_reset(local_d0->context);
  bVar1 = isFormatSRGB(local_18);
  local_12c = 0x25;
  if (bVar1) {
    local_12c = 0x2b;
  }
  std::__cxx11::string::string(local_150,in_RSI);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  createFormatDescriptor(vkFormat_00,(Reporter *)CONCAT44(aVar2,in_stack_fffffffffffffe20));
  saveImageFile(in_stack_00000268,(string *)compressedSize,compressedData._7_1_,
                (char *)CONCAT44(in_stack_00000254,height),in_stack_00000248,this._4_4_,
                in_stack_00000280,in_stack_00000288,in_stack_00000290);
  FormatDescriptor::~FormatDescriptor
            ((FormatDescriptor *)CONCAT44(in_stack_fffffffffffffdc4,local_24));
  std::__cxx11::string::~string(local_150);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,local_24));
  decodeAndSaveASTC::ASTCencStruct::~ASTCencStruct((ASTCencStruct *)0x26eaa1);
  return;
}

Assistant:

void CommandExtract::decodeAndSaveASTC(std::string filepath, bool appendExtension, VkFormat vkFormat, const FormatDescriptor& format,
        uint32_t width, uint32_t height, const char* compressedData, std::size_t compressedSize) {

    const auto threadCount = 1u;
    const auto blockSizeX = format.basic.texelBlockDimension0 + 1u;
    const auto blockSizeY = format.basic.texelBlockDimension1 + 1u;
    const auto blockSizeZ = format.basic.texelBlockDimension2 + 1u;
    static constexpr astcenc_swizzle swizzle{ASTCENC_SWZ_R, ASTCENC_SWZ_G, ASTCENC_SWZ_B, ASTCENC_SWZ_A};

    astcenc_error ec = ASTCENC_SUCCESS;

    const astcenc_profile profile = isFormatSRGB(vkFormat) ? ASTCENC_PRF_LDR_SRGB : ASTCENC_PRF_LDR;
    astcenc_config config{};
    ec = astcenc_config_init(profile, blockSizeX, blockSizeY, blockSizeZ, ASTCENC_PRE_MEDIUM, ASTCENC_FLG_DECOMPRESS_ONLY, &config);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec config init failed: {}", astcenc_get_error_string(ec));

    struct ASTCencStruct {
        astcenc_context* context = nullptr;
        ~ASTCencStruct() {
            astcenc_context_free(context);
        }
    } astcenc;
    astcenc_context*& context = astcenc.context;

    ec = astcenc_context_alloc(&config, threadCount, &context);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec context alloc failed: {}", astcenc_get_error_string(ec));

    astcenc_image image{};
    image.dim_x = width;
    image.dim_y = height;
    image.dim_z = 1; // 3D ASTC formats are currently not supported
    const auto uncompressedSize = width * height * 4 * sizeof(uint8_t);
    const auto uncompressedBuffer = std::make_unique<uint8_t[]>(uncompressedSize);
    auto* bufferPtr = uncompressedBuffer.get();
    image.data = reinterpret_cast<void**>(&bufferPtr);
    image.data_type = ASTCENC_TYPE_U8;

    ec = astcenc_decompress_image(context, reinterpret_cast<const uint8_t*>(compressedData), compressedSize, &image, &swizzle, 0);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec decompress failed: {}", astcenc_get_error_string(ec));
    astcenc_decompress_reset(context);

    const auto uncompressedVkFormat = isFormatSRGB(vkFormat) ?
            VK_FORMAT_R8G8B8A8_SRGB :
            VK_FORMAT_R8G8B8A8_UNORM;
    saveImageFile(
            std::move(filepath),
            appendExtension,
            reinterpret_cast<const char*>(uncompressedBuffer.get()),
            uncompressedSize,
            uncompressedVkFormat,
            createFormatDescriptor(uncompressedVkFormat, *this),
            width,
            height);
}